

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O1

int lest::run<3ul>(test (*specification) [3],texts *arguments,ostream *os)

{
  int iVar1;
  int iVar2;
  allocator_type local_69;
  tests local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_50;
  vector<lest::test,_std::allocator<lest::test>_> local_38;
  
  std::ios_base::sync_with_stdio(false);
  std::vector<lest::test,std::allocator<lest::test>>::vector<lest::test_const*,void>
            ((vector<lest::test,std::allocator<lest::test>> *)&local_38,*specification,
             specification[1],&local_69);
  local_68.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_68.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_68.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.super__Vector_base<lest::test,_std::allocator<lest::test>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_50,arguments);
  iVar1 = run(&local_68,&local_50,os);
  iVar2 = 0xff;
  if (iVar1 < 0xff) {
    iVar2 = iVar1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_50);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_68);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_38);
  return iVar2;
}

Assistant:

int run( test const (&specification)[N], texts arguments, std::ostream & os = std::cout )
{
    std::cout.sync_with_stdio( false );
    return (std::min)( run( tests( specification, specification + N ), arguments, os  ), exit_max_value );
}